

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O0

void __thiscall CTextRender::CTextRender(CTextRender *this)

{
  IEngineTextRender *in_RDI;
  uint in_stack_ffffffffffffffdc;
  
  IEngineTextRender::IEngineTextRender(in_RDI);
  (in_RDI->super_ITextRender).super_IInterface._vptr_IInterface =
       (_func_int **)&PTR__CTextRender_00298068;
  in_RDI[1].super_ITextRender.super_IInterface._vptr_IInterface = (_func_int **)0x0;
  *(undefined4 *)&in_RDI[1].super_ITextRender.super_IInterface.m_pKernel = 0x3f800000;
  *(undefined4 *)((long)&in_RDI[1].super_ITextRender.super_IInterface.m_pKernel + 4) = 0x3f800000;
  *(undefined4 *)&in_RDI[2].super_ITextRender.super_IInterface._vptr_IInterface = 0x3f800000;
  *(undefined4 *)((long)&in_RDI[2].super_ITextRender.super_IInterface._vptr_IInterface + 4) =
       0x3f800000;
  *(undefined4 *)&in_RDI[2].super_ITextRender.super_IInterface.m_pKernel = 0;
  *(undefined4 *)((long)&in_RDI[2].super_ITextRender.super_IInterface.m_pKernel + 4) = 0;
  *(undefined4 *)&in_RDI[3].super_ITextRender.super_IInterface._vptr_IInterface = 0;
  *(undefined4 *)((long)&in_RDI[3].super_ITextRender.super_IInterface._vptr_IInterface + 4) =
       0x3e99999a;
  in_RDI[3].super_ITextRender.super_IInterface.m_pKernel = (IKernel *)0x0;
  *(undefined4 *)&in_RDI[0xc].super_ITextRender.super_IInterface._vptr_IInterface = 0;
  *(undefined4 *)((long)&in_RDI[0xc].super_ITextRender.super_IInterface._vptr_IInterface + 4) =
       0xffffffff;
  in_RDI[0xc].super_ITextRender.super_IInterface.m_pKernel = (IKernel *)0x0;
  mem_zero(in_RDI,in_stack_ffffffffffffffdc);
  return;
}

Assistant:

CTextRender::CTextRender()
{
	m_pGraphics = 0;

	m_TextR = 1.0f;
	m_TextG = 1.0f;
	m_TextB = 1.0f;
	m_TextA = 1.0f;
	m_TextSecondaryR = 0.0f;
	m_TextSecondaryG = 0.0f;
	m_TextSecondaryB = 0.0f;
	m_TextSecondaryA = 0.3f;

	m_pGlyphMap = 0;
	m_NumVariants = 0;
	m_CurrentVariant = -1;
	m_paVariants = 0;

	mem_zero(m_apFontData, sizeof(m_apFontData));
}